

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_stats.hpp
# Opt level: O1

void __thiscall
so_5::disp::reuse::thread_pool_stats::data_source_t::collector_t::~collector_t(collector_t *this)

{
  queue_description_holder_t *pqVar1;
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t> holder;
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t> current;
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t> local_38;
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t> local_30;
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t> local_28;
  
  (this->super_stats_consumer_t)._vptr_stats_consumer_t =
       (_func_int **)&PTR_set_thread_count_0028deb0;
  local_38.m_obj = (this->m_queue_desc_head).m_obj;
  if (local_38.m_obj != (queue_description_holder_t *)0x0) {
    LOCK();
    ((local_38.m_obj)->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>.
    _M_i = ((local_38.m_obj)->super_atomic_refcounted_t).m_ref_counter.
           super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::dismiss_object
            (&this->m_queue_desc_head);
  if (local_38.m_obj != (queue_description_holder_t *)0x0) {
    do {
      local_28.m_obj = local_38.m_obj;
      LOCK();
      ((local_38.m_obj)->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>
      ._M_i = ((local_38.m_obj)->super_atomic_refcounted_t).m_ref_counter.
              super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      pqVar1 = ((local_38.m_obj)->m_next).m_obj;
      if (pqVar1 != (queue_description_holder_t *)0x0) {
        LOCK();
        (pqVar1->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>._M_i =
             (pqVar1->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>.
             _M_i + 1;
        UNLOCK();
      }
      local_30.m_obj = local_38.m_obj;
      local_38.m_obj = pqVar1;
      intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::
      dismiss_object(&local_30);
      intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::
      dismiss_object(&(local_28.m_obj)->m_next);
      intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::
      dismiss_object(&local_28);
    } while (local_38.m_obj != (queue_description_holder_t *)0x0);
  }
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::dismiss_object
            (&this->m_queue_desc_tail);
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::dismiss_object
            (&local_38);
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::dismiss_object
            (&this->m_queue_desc_tail);
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::dismiss_object
            (&this->m_queue_desc_head);
  return;
}

Assistant:

~collector_t()
					{
						// Chain of queue data sources must be cleaned up.
						auto holder = m_queue_desc_head;
						m_queue_desc_head.reset();

						while( holder )
							{
								auto current = holder;
								holder = holder->m_next;
								current->m_next.reset();
							}

						m_queue_desc_tail.reset();
					}